

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walIndexTryHdr(Wal *pWal,int *pChanged)

{
  WalIndexHdr *__s1;
  u16 uVar1;
  u32 *puVar2;
  int iVar3;
  int iVar4;
  u32 aCksum [2];
  WalIndexHdr h1;
  WalIndexHdr h2;
  
  puVar2 = *pWal->apWiData;
  h1.iVersion = puVar2[0];
  h1.unused = puVar2[1];
  h1._8_8_ = *(undefined8 *)(puVar2 + 2);
  h1.mxFrame = puVar2[4];
  h1.nPage = puVar2[5];
  h1.aFrameCksum = *(u32 (*) [2])(puVar2 + 6);
  h1.aSalt = *(u32 (*) [2])(puVar2 + 8);
  h1.aCksum = *(u32 (*) [2])(puVar2 + 10);
  walShmBarrier(pWal);
  h2.iVersion = puVar2[0xc];
  h2.unused = puVar2[0xd];
  h2._8_8_ = *(undefined8 *)(puVar2 + 0xe);
  h2.mxFrame = puVar2[0x10];
  h2.nPage = puVar2[0x11];
  h2.aFrameCksum = *(u32 (*) [2])(puVar2 + 0x12);
  h2.aSalt = *(u32 (*) [2])(puVar2 + 0x14);
  h2.aCksum = *(u32 (*) [2])(puVar2 + 0x16);
  iVar3 = bcmp(&h1,&h2,0x30);
  iVar4 = 1;
  if ((iVar3 == 0) && (h1.isInit != '\0')) {
    walChecksumBytes(1,(u8 *)&h1,0x28,(u32 *)0x0,aCksum);
    if ((aCksum[0] == h1.aCksum[0]) && (aCksum[1] == h1.aCksum[1])) {
      __s1 = &pWal->hdr;
      iVar3 = bcmp(__s1,&h1,0x30);
      iVar4 = 0;
      if (iVar3 != 0) {
        *pChanged = 1;
        *&(pWal->hdr).aSalt = h1.aSalt;
        *&(pWal->hdr).aCksum = h1.aCksum;
        (pWal->hdr).mxFrame = h1.mxFrame;
        (pWal->hdr).nPage = h1.nPage;
        *&(pWal->hdr).aFrameCksum = h1.aFrameCksum;
        __s1->iVersion = h1.iVersion;
        __s1->unused = h1.unused;
        (pWal->hdr).iChange = h1.iChange;
        (pWal->hdr).isInit = h1.isInit;
        (pWal->hdr).bigEndCksum = h1.bigEndCksum;
        (pWal->hdr).szPage = h1.szPage;
        uVar1 = (pWal->hdr).szPage;
        pWal->szPage = CONCAT22(uVar1,uVar1) & 0x1fe00;
      }
    }
  }
  return iVar4;
}

Assistant:

static int walIndexTryHdr(Wal *pWal, int *pChanged){
  u32 aCksum[2];                  /* Checksum on the header content */
  WalIndexHdr h1, h2;             /* Two copies of the header content */
  WalIndexHdr volatile *aHdr;     /* Header in shared memory */

  /* The first page of the wal-index must be mapped at this point. */
  assert( pWal->nWiData>0 && pWal->apWiData[0] );

  /* Read the header. This might happen concurrently with a write to the
  ** same area of shared memory on a different CPU in a SMP,
  ** meaning it is possible that an inconsistent snapshot is read
  ** from the file. If this happens, return non-zero.
  **
  ** There are two copies of the header at the beginning of the wal-index.
  ** When reading, read [0] first then [1].  Writes are in the reverse order.
  ** Memory barriers are used to prevent the compiler or the hardware from
  ** reordering the reads and writes.
  */
  aHdr = walIndexHdr(pWal);
  memcpy(&h1, (void *)&aHdr[0], sizeof(h1));
  walShmBarrier(pWal);
  memcpy(&h2, (void *)&aHdr[1], sizeof(h2));

  if( memcmp(&h1, &h2, sizeof(h1))!=0 ){
    return 1;   /* Dirty read */
  }  
  if( h1.isInit==0 ){
    return 1;   /* Malformed header - probably all zeros */
  }
  walChecksumBytes(1, (u8*)&h1, sizeof(h1)-sizeof(h1.aCksum), 0, aCksum);
  if( aCksum[0]!=h1.aCksum[0] || aCksum[1]!=h1.aCksum[1] ){
    return 1;   /* Checksum does not match */
  }

  if( memcmp(&pWal->hdr, &h1, sizeof(WalIndexHdr)) ){
    *pChanged = 1;
    memcpy(&pWal->hdr, &h1, sizeof(WalIndexHdr));
    pWal->szPage = (pWal->hdr.szPage&0xfe00) + ((pWal->hdr.szPage&0x0001)<<16);
    testcase( pWal->szPage<=32768 );
    testcase( pWal->szPage>=65536 );
  }

  /* The header was successfully read. Return zero. */
  return 0;
}